

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O0

ExprNode * parse_expr(ParserState *ps)

{
  long lVar1;
  size_t sVar2;
  ExprNode *ps_00;
  void *pvVar3;
  void *endv;
  char *errtext;
  ptrlen pVar4;
  void *local_48;
  size_t local_40;
  size_t local_38;
  size_t subexprs_size;
  ExprNode *en;
  ParserState *pPStack_20;
  Token operator;
  ExprNode *subexpr;
  ParserState *ps_local;
  
  subexpr = (ExprNode *)ps;
  pPStack_20 = (ParserState *)parse_atom(ps);
  if (pPStack_20 == (ParserState *)0x0) {
    ps_local = (ParserState *)0x0;
  }
  else if (((int)(subexpr->text).len == 2) || (ps_local = pPStack_20, (int)(subexpr->text).len == 3)
          ) {
    en._4_4_ = (int)(subexpr->text).len;
    subexprs_size =
         (size_t)exprnode_new((uint)((int)(subexpr->text).len != 2),
                              *(ptrlen *)&(pPStack_20->currtext).len);
    local_38 = 0;
    pvVar3 = safegrowarray((((ExprNode *)subexprs_size)->field_2).field_0.subexprs,&local_38,8,
                           (((ExprNode *)subexprs_size)->field_2).field_0.nsubexprs,1,false);
    *(void **)(subexprs_size + 0x18) = pvVar3;
    lVar1 = *(long *)(subexprs_size + 0x20);
    *(long *)(subexprs_size + 0x20) = lVar1 + 1;
    *(ParserState **)(*(long *)(subexprs_size + 0x18) + lVar1 * 8) = pPStack_20;
    do {
      advance((ParserState *)subexpr);
      pPStack_20 = (ParserState *)parse_atom((ParserState *)subexpr);
      if (pPStack_20 == (ParserState *)0x0) {
        exprnode_free((ExprNode *)subexprs_size);
        return (ExprNode *)0x0;
      }
      pvVar3 = safegrowarray(*(void **)(subexprs_size + 0x18),&local_38,8,
                             *(size_t *)(subexprs_size + 0x20),1,false);
      sVar2 = subexprs_size;
      *(void **)(subexprs_size + 0x18) = pvVar3;
      lVar1 = *(long *)(subexprs_size + 0x20);
      *(long *)(subexprs_size + 0x20) = lVar1 + 1;
      *(ParserState **)(*(long *)(subexprs_size + 0x18) + lVar1 * 8) = pPStack_20;
      pvVar3 = *(void **)(subexprs_size + 8);
      endv = ptrlen_end(*(ptrlen *)&(pPStack_20->currtext).len);
      pVar4 = make_ptrlen_startend(pvVar3,endv);
      ps_00 = subexpr;
      local_48 = pVar4.ptr;
      *(void **)(sVar2 + 8) = local_48;
      local_40 = pVar4.len;
      *(size_t *)(sVar2 + 0x10) = local_40;
      if (((int)(subexpr->text).len != 2) && ((int)(subexpr->text).len != 3)) {
        return (ExprNode *)subexprs_size;
      }
    } while ((int)(subexpr->text).len == en._4_4_);
    errtext = dupstr("expected parentheses to disambiguate && and || on either side of expression");
    error((ParserState *)ps_00,errtext,*(ptrlen *)&(pPStack_20->currtext).len);
    exprnode_free((ExprNode *)subexprs_size);
    ps_local = (ParserState *)0x0;
  }
  return (ExprNode *)ps_local;
}

Assistant:

static ExprNode *parse_expr(ParserState *ps)
{
    ExprNode *subexpr = parse_atom(ps);
    if (!subexpr)
        return NULL;

    if (ps->tok != TOK_AND && ps->tok != TOK_OR)
        return subexpr;

    Token operator = ps->tok;
    ExprNode *en = exprnode_new(ps->tok == TOK_AND ? OP_AND : OP_OR,
                                subexpr->text);
    size_t subexprs_size = 0;

    sgrowarray(en->subexprs, subexprs_size, en->nsubexprs);
    en->subexprs[en->nsubexprs++] = subexpr;

    while (true) {
        advance(ps);                   /* eat the operator */

        subexpr = parse_atom(ps);
        if (!subexpr) {
            exprnode_free(en);
            return NULL;
        }
        sgrowarray(en->subexprs, subexprs_size, en->nsubexprs);
        en->subexprs[en->nsubexprs++] = subexpr;
        en->text = make_ptrlen_startend(
            en->text.ptr, ptrlen_end(subexpr->text));

        if (ps->tok != TOK_AND && ps->tok != TOK_OR)
            return en;

        if (ps->tok != operator) {
            error(ps, dupstr("expected parentheses to disambiguate && and || "
                             "on either side of expression"), subexpr->text);
            exprnode_free(en);
            return NULL;
        }
    }
}